

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

char * lua_setupvalue(lua_State *L,int idx,int n)

{
  TValue *tvp;
  global_State *g;
  uint32_t in_ESI;
  cTValue *in_RDI;
  char *name;
  GCobj *o;
  TValue *val;
  cTValue *f;
  GCobj *in_stack_ffffffffffffff98;
  long local_58;
  GCobj **in_stack_ffffffffffffffb0;
  
  tvp = index2adr((lua_State *)&in_RDI->field_2,in_ESI);
  g = (global_State *)lj_debug_uvnamev(in_RDI,in_ESI,(TValue **)tvp,in_stack_ffffffffffffffb0);
  if (g != (global_State *)0x0) {
    in_RDI[3].u64 = in_RDI[3].u64 - 8;
    *in_stack_ffffffffffffffb0 = *(GCobj **)in_RDI[3];
    if (((0xfffffff6 < *(int *)(in_RDI[3].u64 + 4) + 4U) &&
        ((*(byte *)((ulong)*(uint *)in_RDI[3] + 4) & 3) != 0)) &&
       ((*(byte *)(local_58 + 4) & 4) != 0)) {
      lj_gc_barrierf(g,in_stack_ffffffffffffff98,(GCobj *)0x10fb40);
    }
  }
  return (char *)g;
}

Assistant:

LUA_API const char *lua_setupvalue(lua_State *L, int idx, int n)
{
  cTValue *f = index2adr(L, idx);
  TValue *val;
  GCobj *o;
  const char *name;
  lj_checkapi_slot(1);
  name = lj_debug_uvnamev(f, (uint32_t)(n-1), &val, &o);
  if (name) {
    L->top--;
    copyTV(L, val, L->top);
    lj_gc_barrier(L, o, L->top);
  }
  return name;
}